

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::CoroutineBase::fire(CoroutineBase *this)

{
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar1;
  
  (*(code *)**(undefined8 **)(in_RSI + 0x50))();
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<Event>> CoroutineBase::fire() {
  // Call PromiseAwaiter::await_resume() and proceed with the coroutine. Note that this will not
  // destroy the coroutine if control flows off the end of it, because we return suspend_always()
  // from final_suspend().
  //
  // It's tempting to arrange to check for exceptions right now and reject the promise that owns
  // us without resuming the coroutine, which would save us from throwing an exception when we
  // already know where it's going. But, we don't really know: the `co_await` might be in a
  // try-catch block, so we have no choice but to resume and throw later.

  coroutine.resume();

  return kj::none;
}